

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_gauss_s2_precomputed(integral_image *iimage,interest_point *ipoint)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int i;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int s;
  int col;
  int iVar12;
  int row;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_register_00001384 [12];
  int local_e8;
  int local_e0;
  long local_d8;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  float local_78;
  float local_68;
  undefined1 extraout_var [60];
  
  auVar15._8_4_ = 0x3effffff;
  auVar15._0_8_ = 0x3effffff3effffff;
  auVar15._12_4_ = 0x3effffff;
  auVar21._8_4_ = 0x80000000;
  auVar21._0_8_ = 0x8000000080000000;
  auVar21._12_4_ = 0x80000000;
  fVar20 = ipoint->scale;
  auVar13 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)fVar20),auVar21,0xf8);
  auVar13 = ZEXT416((uint)(fVar20 + auVar13._0_4_));
  auVar13 = vroundss_avx(auVar13,auVar13,0xb);
  s = (int)(auVar13._0_4_ + auVar13._0_4_);
  auVar14 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)ipoint->y),auVar21,0xf8);
  auVar13 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)ipoint->x),auVar21,0xf8);
  auVar17._0_8_ = (double)fVar20;
  auVar17._8_8_ = 0;
  auVar13 = ZEXT416((uint)(ipoint->x + auVar13._0_4_));
  auVar13 = vroundss_avx(auVar13,auVar13,0xb);
  auVar16._0_8_ = (double)auVar13._0_4_;
  auVar16._8_8_ = auVar13._8_8_;
  auVar21 = vfmadd231sd_fma(auVar16,auVar17,ZEXT816(0x3fe0000000000000));
  auVar13 = ZEXT416((uint)(ipoint->y + auVar14._0_4_));
  auVar13 = vroundss_avx(auVar13,auVar13,0xb);
  auVar14._0_8_ = (double)auVar13._0_4_;
  auVar14._8_8_ = auVar13._8_8_;
  auVar13 = vfmadd231sd_fma(auVar14,auVar17,ZEXT816(0x3fe0000000000000));
  auVar29 = ZEXT864(0) << 0x20;
  iVar12 = 0;
  local_e8 = 0;
  local_d8 = 0;
  for (iVar9 = -8; iVar9 < 8; iVar9 = iVar9 + 5) {
    auVar37._0_4_ = (float)iVar9;
    auVar37._4_12_ = in_register_00001384;
    lVar10 = (long)local_e8;
    auVar14 = vfmadd132ss_fma(auVar37,ZEXT416((uint)(float)auVar21._0_8_),ZEXT416((uint)fVar20));
    auVar31._8_4_ = 0x3effffff;
    auVar31._0_8_ = 0x3effffff3effffff;
    auVar31._12_4_ = 0x3effffff;
    local_d8 = (long)(int)local_d8;
    local_e8 = local_e8 + 4;
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar15 = vpternlogd_avx512vl(auVar31,auVar14,auVar1,0xf8);
    auVar14 = ZEXT416((uint)(auVar14._0_4_ + auVar15._0_4_));
    auVar14 = vroundss_avx(auVar14,auVar14,0xb);
    auVar32._0_4_ = (int)auVar14._0_4_;
    auVar32._4_4_ = (int)auVar14._4_4_;
    auVar32._8_4_ = (int)auVar14._8_4_;
    auVar32._12_4_ = (int)auVar14._12_4_;
    auVar14 = vcvtdq2ps_avx(auVar32);
    local_e0 = -3;
    iVar8 = -8;
    while (lVar10 != local_e8) {
      auVar22._0_4_ = (float)iVar8;
      auVar22._4_12_ = in_register_00001384;
      auVar15 = vfmadd132ss_fma(auVar22,ZEXT416((uint)(float)auVar13._0_8_),ZEXT416((uint)fVar20));
      auVar33._8_4_ = 0x3effffff;
      auVar33._0_8_ = 0x3effffff3effffff;
      auVar33._12_4_ = 0x3effffff;
      iVar7 = iVar8 + -4;
      auVar2._8_4_ = 0x80000000;
      auVar2._0_8_ = 0x8000000080000000;
      auVar2._12_4_ = 0x80000000;
      auVar16 = vpternlogd_avx512vl(auVar33,auVar15,auVar2,0xf8);
      auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_));
      auVar15 = vroundss_avx(auVar15,auVar15,0xb);
      auVar23._0_4_ = (int)auVar15._0_4_;
      auVar23._4_4_ = (int)auVar15._4_4_;
      auVar23._8_4_ = (int)auVar15._8_4_;
      auVar23._12_4_ = (int)auVar15._12_4_;
      auVar15 = vcvtdq2ps_avx(auVar23);
      _local_98 = ZEXT816(0) << 0x20;
      for (; iVar7 != local_e0; iVar7 = iVar7 + 1) {
        auVar24._0_4_ = (float)iVar7;
        auVar24._4_12_ = in_register_00001384;
        auVar16 = vfmadd132ss_fma(auVar24,ZEXT416((uint)(float)auVar13._0_8_),ZEXT416((uint)fVar20))
        ;
        auVar34._8_4_ = 0x3effffff;
        auVar34._0_8_ = 0x3effffff3effffff;
        auVar34._12_4_ = 0x3effffff;
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar17 = vpternlogd_avx512vl(auVar34,auVar16,auVar3,0xf8);
        local_78 = auVar15._0_4_;
        auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
        auVar16 = vroundss_avx(auVar16,auVar16,0xb);
        row = (int)auVar16._0_4_;
        auVar25._0_4_ = (int)auVar16._0_4_;
        auVar25._4_4_ = (int)auVar16._4_4_;
        auVar25._8_4_ = (int)auVar16._8_4_;
        auVar25._12_4_ = (int)auVar16._12_4_;
        auVar16 = vcvtdq2ps_avx(auVar25);
        local_78 = local_78 - auVar16._0_4_;
        iVar11 = -0xc;
        while (iVar11 != -3) {
          auVar26._0_4_ = (float)(iVar12 + iVar11);
          auVar26._4_12_ = in_register_00001384;
          auVar16 = vfmadd132ss_fma(auVar26,ZEXT416((uint)(float)auVar21._0_8_),
                                    ZEXT416((uint)fVar20));
          auVar35._8_4_ = 0x3effffff;
          auVar35._0_8_ = 0x3effffff3effffff;
          auVar35._12_4_ = 0x3effffff;
          auVar4._8_4_ = 0x80000000;
          auVar4._0_8_ = 0x8000000080000000;
          auVar4._12_4_ = 0x80000000;
          auVar17 = vpternlogd_avx512vl(auVar35,auVar16,auVar4,0xf8);
          local_68 = auVar14._0_4_;
          auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar17._0_4_));
          auVar16 = vroundss_avx(auVar16,auVar16,0xb);
          col = (int)auVar16._0_4_;
          auVar27._0_4_ = (int)auVar16._0_4_;
          auVar27._4_4_ = (int)auVar16._4_4_;
          auVar27._8_4_ = (int)auVar16._8_4_;
          auVar27._12_4_ = (int)auVar16._12_4_;
          auVar16 = vcvtdq2ps_avx(auVar27);
          local_68 = local_68 - auVar16._0_4_;
          fVar18 = expf((local_68 * local_68 + local_78 * local_78) * (-0.08 / (fVar20 * fVar20)));
          fVar19 = haarX_improved(iimage,row,col,s);
          auVar30._0_4_ = haarY_improved(iimage,row,col,s);
          auVar30._4_60_ = extraout_var;
          auVar16 = vinsertps_avx(auVar30._0_16_,ZEXT416((uint)fVar19),0x10);
          iVar11 = iVar11 + 1;
          auVar28._0_4_ = fVar18 * auVar16._0_4_;
          auVar28._4_4_ = fVar18 * auVar16._4_4_;
          auVar28._8_4_ = fVar18 * auVar16._8_4_;
          auVar28._12_4_ = fVar18 * auVar16._12_4_;
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar16 = vandps_avx512vl(auVar28,auVar5);
          auVar16 = vmovlhps_avx(auVar28,auVar16);
          local_98._4_4_ = (float)local_98._4_4_ + auVar16._4_4_;
          local_98._0_4_ = (float)local_98._0_4_ + auVar16._0_4_;
          fStack_90 = fStack_90 + auVar16._8_4_;
          fStack_8c = fStack_8c + auVar16._12_4_;
        }
      }
      local_e0 = local_e0 + 5;
      fVar18 = gauss_s2_arr[lVar10];
      auVar6._4_4_ = fVar18;
      auVar6._0_4_ = fVar18;
      auVar6._8_4_ = fVar18;
      auVar6._12_4_ = fVar18;
      auVar17 = vmulps_avx512vl(_local_98,auVar6);
      iVar8 = iVar8 + 5;
      lVar10 = lVar10 + 1;
      auVar36._0_4_ = auVar17._0_4_ * auVar17._0_4_;
      auVar36._4_4_ = auVar17._4_4_ * auVar17._4_4_;
      auVar36._8_4_ = auVar17._8_4_ * auVar17._8_4_;
      auVar36._12_4_ = auVar17._12_4_ * auVar17._12_4_;
      auVar16 = vshufpd_avx(auVar17,auVar17,1);
      *(undefined1 (*) [16])(ipoint->descriptor + local_d8) = auVar17;
      local_d8 = local_d8 + 4;
      auVar15 = vmovshdup_avx(auVar36);
      auVar15 = vfmadd231ss_fma(auVar15,auVar17,auVar17);
      auVar16 = vfmadd213ss_fma(auVar16,auVar16,auVar15);
      auVar15 = vshufps_avx(auVar17,auVar17,0xff);
      auVar15 = vfmadd213ss_fma(auVar15,auVar15,auVar16);
      auVar29 = ZEXT464((uint)(auVar29._0_4_ + auVar15._0_4_));
    }
    iVar12 = iVar12 + 5;
  }
  if (auVar29._0_4_ < 0.0) {
    fVar20 = sqrtf(auVar29._0_4_);
  }
  else {
    auVar13 = vsqrtss_avx(auVar29._0_16_,auVar29._0_16_);
    fVar20 = auVar13._0_4_;
  }
  for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 1) {
    ipoint->descriptor[lVar10] = (1.0 / fVar20) * ipoint->descriptor[lVar10];
  }
  return;
}

Assistant:

void get_msurf_descriptor_gauss_s2_precomputed(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
        - use array gauss_s2_precomputed and index gauss_s2_index for precomputed gauss_s2 values

    ideas:
        - 
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale_mul_2 = (int) 2 * roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
     // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get the gaussian weighted x and y responses
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = haarX_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    float ry = haarY_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}